

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *os,Array *array)

{
  ostream *poVar1;
  optional<wasm::HeapType> super;
  undefined1 local_a8 [12];
  TypePrinter local_98;
  Array *local_18;
  Array *array_local;
  ostream *os_local;
  
  local_18 = array;
  array_local = (Array *)os;
  anon_unknown_0::TypePrinter::TypePrinter(&local_98,os);
  std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)local_a8);
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a8._0_8_;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a8[8];
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a8._9_3_;
  poVar1 = anon_unknown_0::TypePrinter::print(&local_98,array,super);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_98);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Array array) {
  return TypePrinter(os).print(array);
}